

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O2

void printDefines(FILE *out,TA_FuncInfo *funcInfo)

{
  TA_IntegerList *pTVar1;
  long *plVar2;
  TA_RetCode TVar3;
  char *pcVar4;
  char to;
  char to_00;
  uint paramIndex;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_IntegerList *local_38;
  
  if (out != (FILE *)0x0) {
    local_38 = &TA_MA_TypeList;
    for (paramIndex = 0; paramIndex < funcInfo->nbOptInput; paramIndex = paramIndex + 1) {
      TVar3 = TA_GetOptInputParameterInfo(funcInfo->handle,paramIndex,&optInputParamInfo);
      if (TVar3 != TA_SUCCESS) {
        printf("[%s] invalid \'optional input\' information\n",funcInfo->name);
        return;
      }
      pcVar4 = optInputParamInfo->paramName;
      if (optInputParamInfo->type == TA_OptInput_RealList) {
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "optInReal";
        }
        fprintf((FILE *)out,"\n/* TA_%s: Optional Parameter %s */\n",funcInfo->name,pcVar4);
        plVar2 = (long *)optInputParamInfo->dataSet;
        lVar6 = 0;
        for (uVar7 = 0; uVar7 < *(uint *)(plVar2 + 1); uVar7 = uVar7 + 1) {
          pcVar4 = *(char **)(*plVar2 + 8 + lVar6);
          pcVar5 = gTempBuf;
          strcpy(gTempBuf,pcVar4);
          cnvtChar(pcVar5,(char)pcVar4,to_00);
          trimWhitespace(pcVar5);
          cnvtToUpperCase(pcVar5);
          pcVar4 = funcInfo->name;
          doubleToStr(*(double *)(*plVar2 + lVar6));
          fprintf((FILE *)out,"#define TA_%s_%s %s\n",pcVar4,gTempBuf,gTempDoubleToStr);
          lVar6 = lVar6 + 0x10;
        }
LAB_00116e9e:
        fputc(10,(FILE *)out);
      }
      else if ((optInputParamInfo->type == TA_OptInput_IntegerList) &&
              (pTVar1 = (TA_IntegerList *)optInputParamInfo->dataSet, pTVar1 != local_38)) {
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "optInInteger";
        }
        fprintf((FILE *)out,"\n/* TA_%s: Optional Parameter %s */\n",funcInfo->name,pcVar4);
        lVar6 = 0;
        for (uVar7 = 0; uVar7 < pTVar1->nbElement; uVar7 = uVar7 + 1) {
          pcVar4 = *(char **)((long)&pTVar1->data->string + lVar6);
          pcVar5 = gTempBuf;
          strcpy(gTempBuf,pcVar4);
          cnvtChar(pcVar5,(char)pcVar4,to);
          trimWhitespace(pcVar5);
          cnvtToUpperCase(pcVar5);
          fprintf((FILE *)out,"#define TA_%s_%s %d\n",funcInfo->name,gTempBuf,
                  (ulong)*(uint *)((long)&pTVar1->data->value + lVar6));
          lVar6 = lVar6 + 0x10;
        }
        goto LAB_00116e9e;
      }
    }
  }
  return;
}

Assistant:

static void printDefines( FILE *out, const TA_FuncInfo *funcInfo )
{
   TA_RetCode retCode;
   const TA_OptInputParameterInfo *optInputParamInfo;
   unsigned int i, j;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   TA_IntegerList *intList;
   TA_RealList    *realList;

   if (!out) return;

   /* Go through the optional parameter and print
    * the corresponding define for the TA_OptInput_IntegerList
    * and TA_OptInput_RealList having a string.
    */
   paramNb = 0;
   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                             i, &optInputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
         return;
      }

      paramName = optInputParamInfo->paramName;

      /* TA_MA: Value for parameter */

      switch( optInputParamInfo->type )
      {
      case TA_OptInput_RealList:
         defaultParamName = "optInReal";
         break;
      case TA_OptInput_IntegerList:
         defaultParamName = "optInInteger";
         break;
      default:
         paramNb++;
         continue; /* Skip other type of parameter */
      }

      if( !paramName )
         paramName = defaultParamName;

      /* Output a comment to guide the user. */
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_IntegerList:
            intList = (TA_IntegerList *)optInputParamInfo->dataSet;
            if( intList != (TA_IntegerList *)TA_DEF_UI_MA_Method.dataSet )
            {
               fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                        funcInfo->name, paramName );
               for( j=0; j < intList->nbElement; j++ )
               {
                  strcpy( gTempBuf, intList->data[j].string );
                  cnvtChar( gTempBuf, ' ', '_' );
                  trimWhitespace( gTempBuf );
                  cnvtToUpperCase( gTempBuf );
                  fprintf( out, "#define TA_%s_%s %d\n",
                           funcInfo->name,
                           gTempBuf,
                           intList->data[j].value );

               }
               fprintf( out, "\n" );
            }
            break;
         case TA_OptInput_RealList:
            fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                     funcInfo->name, paramName );

            realList = (TA_RealList *)optInputParamInfo->dataSet;
            for( j=0; j < realList->nbElement; j++ )
            {
               strcpy( gTempBuf, realList->data[j].string );
               cnvtChar( gTempBuf, ' ', '_' );
               trimWhitespace( gTempBuf );
               cnvtToUpperCase( gTempBuf );
               fprintf( out, "#define TA_%s_%s %s\n",
                        funcInfo->name,
                        gTempBuf,
                        doubleToStr(realList->data[j].value) );

            }
            fprintf( out, "\n" );
            break;
         default:
            /* Do nothing */
            break;
         }

      paramNb++;
   }
}